

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppleII.cpp
# Opt level: O3

void __thiscall
Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_true>::
update_just_in_time_cards(ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_true> *this)

{
  pointer ppCVar1;
  Card **card;
  pointer ppCVar2;
  
  if (0 < (this->cycles_since_card_update_).super_WrappedInt<Cycles>.length_) {
    ppCVar1 = (this->just_in_time_cards_).
              super__Vector_base<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppCVar2 = (this->just_in_time_cards_).
                   super__Vector_base<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>._M_impl
                   .super__Vector_impl_data._M_start; ppCVar2 != ppCVar1; ppCVar2 = ppCVar2 + 1) {
      (*(*ppCVar2)->_vptr_Card[2])
                (*ppCVar2,(this->cycles_since_card_update_).super_WrappedInt<Cycles>.length_,
                 (ulong)(uint)this->stretched_cycles_since_card_update_);
    }
  }
  (this->cycles_since_card_update_).super_WrappedInt<Cycles>.length_ = 0;
  this->stretched_cycles_since_card_update_ = 0;
  return;
}

Assistant:

void update_just_in_time_cards() {
			if(cycles_since_card_update_ > Cycles(0)) {
				for(const auto &card : just_in_time_cards_) {
					card->run_for(cycles_since_card_update_, stretched_cycles_since_card_update_);
				}
			}
			cycles_since_card_update_ = 0;
			stretched_cycles_since_card_update_ = 0;
		}